

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O2

effect_index effect_lookup(char *name)

{
  int iVar1;
  size_t i;
  long lVar2;
  char **ppcVar3;
  
  ppcVar3 = effect_names;
  lVar2 = 0;
  do {
    if (lVar2 != 0) {
      if (lVar2 == 0x80) {
        lVar2 = 0x80;
LAB_00140842:
        return (effect_index)lVar2;
      }
      iVar1 = strcmp(name,*ppcVar3);
      if (iVar1 == 0) goto LAB_00140842;
    }
    lVar2 = lVar2 + 1;
    ppcVar3 = ppcVar3 + 1;
  } while( true );
}

Assistant:

effect_index effect_lookup(const char *name)
{
	size_t i;

	for (i = 0; i < N_ELEMENTS(effect_names); i++) {
		const char *effect_name = effect_names[i];

		/* Test for equality */
		if (effect_name != NULL && streq(name, effect_name))
			return i;
	}

	return EF_MAX;
}